

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int generate_code(string *language,string *input_file_path,string *out_path)

{
  t_program *ptVar1;
  long lVar2;
  string local_130;
  undefined1 local_109;
  string local_108;
  t_program *local_e8;
  t_program *program;
  string input_file;
  string local_b0 [8];
  string old_input_file;
  string new_thrift_include_path;
  string old_thrift_include_path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generator_strings;
  time_t now;
  bool out_path_is_absolute;
  int i;
  string *out_path_local;
  string *input_file_path_local;
  string *language_local;
  
  generator_strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)time((time_t *)0x0);
  g_time_str = ctime((time_t *)
                     &generator_strings.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(old_thrift_include_path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(new_thrift_include_path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(old_input_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_b0);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             (old_thrift_include_path.field_2._M_local_buf + 8),language);
  initGlobals();
  std::__cxx11::string::string((string *)&program,(string *)input_file_path);
  ptVar1 = (t_program *)operator_new(0x238);
  local_109 = 1;
  std::__cxx11::string::string((string *)&local_108,(string *)&program);
  t_program::t_program(ptVar1,&local_108);
  local_109 = 0;
  std::__cxx11::string::~string((string *)&local_108);
  local_e8 = ptVar1;
  lVar2 = std::__cxx11::string::size();
  ptVar1 = local_e8;
  if (lVar2 != 0) {
    std::__cxx11::string::string((string *)&local_130,(string *)out_path);
    t_program::set_out_path(ptVar1,&local_130,false);
    std::__cxx11::string::~string((string *)&local_130);
  }
  parse(local_e8,(t_program *)0x0);
  std::__cxx11::string::operator=((string *)&g_curpath_abi_cxx11_,"generation");
  yylineno = 1;
  generate(local_e8,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&old_thrift_include_path.field_2 + 8));
  if (local_e8 != (t_program *)0x0) {
    (*(local_e8->super_t_doc)._vptr_t_doc[1])();
  }
  clearGlobals();
  if (((g_return_failure & 1U) == 0) || ((g_audit_fatal & 1U) == 0)) {
    if ((g_generator_failure & 1U) == 0) {
      language_local._4_4_ = 0;
    }
    else {
      language_local._4_4_ = 1;
    }
  }
  else {
    language_local._4_4_ = 1;
  }
  std::__cxx11::string::~string((string *)&program);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)(old_input_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(new_thrift_include_path.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&old_thrift_include_path.field_2 + 8));
  return language_local._4_4_;
}

Assistant:

int generate_code(string language, string input_file_path, string out_path) {
    int i;
//    std::string out_path;
//    out_path = "/Users/hezhaozhao/akulaku/test/thrift/compiler/cpp";
    bool out_path_is_absolute = false;

    // Setup time string
    time_t now = time(nullptr);
    g_time_str = ctime(&now);

    // Check for necessary arguments, you gotta have at least a filename and
    // an output language flag
    vector<string> generator_strings;
    string old_thrift_include_path;
    string new_thrift_include_path;
    string old_input_file;
//    std:string aa = "py";
    generator_strings.emplace_back(language);
    initGlobals();
//    string input_file_path = "/Users/hezhaozhao/akulaku/test/thrift/compiler/cpp/text1.thrift";
    string input_file(input_file_path); // start

    // Instance of the global parse tree
    t_program *program = new t_program(input_file);
    if (out_path.size()) {
        program->set_out_path(out_path, out_path_is_absolute);
    }

    // Compute the cpp include prefix.
    // infer this from the filename passed in
//    string input_filename = argv[i];
//    string include_prefix;
//
//    string::size_type last_slash = string::npos;
//    if ((last_slash = input_filename.rfind("/")) != string::npos) {
//        include_prefix = input_filename.substr(0, last_slash);
//    }
//
//    program->set_include_prefix(include_prefix);

    // Parse it!
    parse(program, nullptr);

    // The current path is not really relevant when we are doing generation.
    // Reset the variable to make warning messages clearer.
    g_curpath = "generation";
    // Reset yylineno for the heck of it.  Use 1 instead of 0 because
    // That is what shows up during argument parsing.
    yylineno = 1;

    // Generate it!
    generate(program, generator_strings);
    delete program;

    clearGlobals();

    // Finished
    if (g_return_failure && g_audit_fatal) {
        return 1;
    }
    if (g_generator_failure) {
        return 1;
    }
    // Finished
    return 0;
}